

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

void * __thiscall embree::FastAllocator::Block::malloc(Block *this,size_t __size)

{
  ulong uVar1;
  ulong uVar2;
  long in_RCX;
  ulong uVar3;
  ulong *in_RDX;
  byte in_R8B;
  
  uVar3 = -in_RCX & (*in_RDX + in_RCX) - 1;
  if (((this->reserveEnd).super___atomic_base<unsigned_long>._M_i <
       (this->cur).super___atomic_base<unsigned_long>._M_i + uVar3 & (in_R8B ^ 1)) == 0) {
    LOCK();
    uVar1 = (this->cur).super___atomic_base<unsigned_long>._M_i;
    (this->cur).super___atomic_base<unsigned_long>._M_i =
         (this->cur).super___atomic_base<unsigned_long>._M_i + uVar3;
    UNLOCK();
    if ((((this->reserveEnd).super___atomic_base<unsigned_long>._M_i < uVar1 + uVar3 & (in_R8B ^ 1))
         == 0) && (uVar1 <= (this->reserveEnd).super___atomic_base<unsigned_long>._M_i)) {
      uVar2 = (this->reserveEnd).super___atomic_base<unsigned_long>._M_i - uVar1;
      if (uVar3 < uVar2) {
        uVar2 = uVar3;
      }
      *in_RDX = uVar2;
      if ((__size != 0) &&
         ((this->allocEnd).super___atomic_base<unsigned_long>._M_i < uVar2 + uVar1)) {
        uVar3 = (this->allocEnd).super___atomic_base<unsigned_long>._M_i;
        if (uVar3 < uVar1) {
          uVar3 = uVar1;
        }
        (*(code *)**(undefined8 **)__size)(__size,(uVar2 + uVar1) - uVar3,1);
      }
      return this->data + uVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

void* malloc(MemoryMonitorInterface* device, size_t& bytes_in, size_t align, bool partial)
      {
        size_t bytes = bytes_in;
        assert(align <= maxAlignment);
        bytes = (bytes+(align-1)) & ~(align-1);
        if (unlikely(cur+bytes > reserveEnd && !partial)) return nullptr;
        const size_t i = cur.fetch_add(bytes);
        if (unlikely(i+bytes > reserveEnd && !partial)) return nullptr;
        if (unlikely(i > reserveEnd)) return nullptr;
        bytes_in = bytes = min(bytes,reserveEnd-i);

        if (i+bytes > allocEnd) {
          if (device) device->memoryMonitor(i+bytes-max(i,allocEnd),true);
        }
        return &data[i];
      }